

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O1

string * __thiscall
flatbuffers::php::PhpGenerator::GenTypePointer_abi_cxx11_
          (string *__return_storage_ptr__,PhpGenerator *this,Type *type)

{
  int iVar1;
  Parser *pPVar2;
  char *pcVar3;
  char *pcVar4;
  undefined4 local_28;
  undefined4 local_24;
  Parser *local_20;
  string *psStack_18;
  undefined2 local_10;
  
  iVar1 = *(int *)&(this->super_BaseGenerator)._vptr_BaseGenerator;
  if (iVar1 == 0xf) {
    pPVar2 = (this->super_BaseGenerator).parser_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pPVar2->super_ParserState).prev_cursor_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,
               (pPVar2->super_ParserState).cursor_ + (long)pcVar3);
  }
  else if (iVar1 == 0xe) {
    local_28 = *(undefined4 *)((long)&(this->super_BaseGenerator)._vptr_BaseGenerator + 4);
    local_20 = (this->super_BaseGenerator).parser_;
    psStack_18 = (this->super_BaseGenerator).path_;
    local_10 = *(undefined2 *)&(this->super_BaseGenerator).file_name_;
    local_24 = 0;
    GenTypeGet_abi_cxx11_(__return_storage_ptr__,(PhpGenerator *)&stack0xffffffffffffffd8,type);
  }
  else {
    if (iVar1 == 0xd) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "string";
      pcVar3 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "Table";
      pcVar3 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenTypePointer(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "string";
      case BASE_TYPE_VECTOR: return GenTypeGet(type.VectorType());
      case BASE_TYPE_STRUCT: return type.struct_def->name;
      case BASE_TYPE_UNION:
        // fall through
      default: return "Table";
    }
  }